

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet_test.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::JsonnetTest_TestEvaluateSnippet_Test::TestBody
          (JsonnetTest_TestEvaluateSnippet_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar;
  char *output;
  int error;
  AssertionResult gtest_ar_;
  JsonnetVm *vm;
  char *snippet;
  bool *in_stack_ffffffffffffff28;
  AssertionResult *in_stack_ffffffffffffff30;
  JsonnetVm *vm_00;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  JsonnetVm *vm_01;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar3;
  Type in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff78;
  undefined1 local_78 [8];
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  AssertionResult *in_stack_ffffffffffffffa8;
  _Base_ptr in_stack_ffffffffffffffb0;
  JsonnetVm *local_18;
  char *local_10;
  
  local_10 = "std.assertEqual(({ x: 1, y: self.x } { x: 2 }).y, 2)";
  local_18 = jsonnet_make();
  vm_01 = (JsonnetVm *)&stack0xffffffffffffffd8;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(type *)0x225a5c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)vm_01);
  uVar3 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               (char *)CONCAT17(uVar3,in_stack_ffffffffffffff50),(int)((ulong)vm_01 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    testing::Message::~Message((Message *)0x225b34);
  }
  local_78._5_3_ = 0;
  local_78[4] = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x225bbc);
  if (local_78._4_4_ == 0) {
    local_78._0_4_ = 0;
    vm_00 = (JsonnetVm *)local_78;
    jsonnet_evaluate_snippet
              ((JsonnetVm *)in_stack_ffffffffffffff78._M_head_impl,in_stack_ffffffffffffff70,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (int *)in_stack_ffffffffffffff60);
    this_00 = (AssertionResult *)&stack0xffffffffffffff70;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)vm_01,(char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (int *)this_00,(int *)vm_00);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)uVar2) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff60);
      testing::AssertionResult::failure_message((AssertionResult *)0x225c8d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 (char *)CONCAT17(uVar3,in_stack_ffffffffffffff50),(int)((ulong)vm_01 >> 0x20),
                 (char *)CONCAT17(uVar2,in_stack_ffffffffffffff40));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)vm_00);
      testing::Message::~Message((Message *)0x225cd9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x225d25);
    jsonnet_realloc(vm_01,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff40),(size_t)this_00);
    jsonnet_destroy(vm_00);
  }
  return;
}

Assistant:

TEST(JsonnetTest, TestEvaluateSnippet)
{
    const char* snippet = "std.assertEqual(({ x: 1, y: self.x } { x: 2 }).y, 2)";
    struct JsonnetVm* vm = jsonnet_make();
    ASSERT_FALSE(vm == nullptr);
    int error = 0;
    char* output = jsonnet_evaluate_snippet(vm, "snippet", snippet, &error);
    EXPECT_EQ(0, error);
    jsonnet_realloc(vm, output, 0);
    jsonnet_destroy(vm);
}